

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O0

void __thiscall LengauerTarjan::run(LengauerTarjan *this,int param_2)

{
  long *in_RDI;
  
  (**(code **)(*in_RDI + 8))();
  (**(code **)(*in_RDI + 0x10))();
  (**(code **)(*in_RDI + 0x18))();
  return;
}

Assistant:

void LengauerTarjan::run(int /*root*/) {
	init();
	DFS();

	/*for (int i = 0; i <= count; i++) {
		cout << "("<<i<<","<<semi[i] <<") ";
		}
		cout <<endl;
	*/
	find_doms();
	/*
		for (int i = 0; i <= count; i++) {
		cout << "("<<i<<","<<idom[i] <<") ";
		}
		cout <<endl;
	*/
}